

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

bool __thiscall Indexing::CodeTree::Matcher::prepareLiteral(Matcher *this)

{
  bool bVar1;
  Matcher *this_local;
  
  bVar1 = this->curLInfo < this->linfoCnt;
  if (bVar1) {
    (this->super_BaseMatcher).tp = 0;
    (this->super_BaseMatcher).op = this->entry;
    (this->super_BaseMatcher).ft = this->linfos[this->curLInfo].ft;
  }
  return bVar1;
}

Assistant:

bool CodeTree::Matcher::prepareLiteral()
{
  if(curLInfo>=linfoCnt) {
    return false;
  }
  tp=0;
  op=entry;
  ft=linfos[curLInfo].ft;
  return true;
}